

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

UINT16 TPMU_SIG_SCHEME_Marshal(TPMU_SIG_SCHEME *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT16 UVar1;
  
  UVar1 = 0;
  switch(selector) {
  case 0x15:
  case 0x17:
  case 0x19:
  case 0x1b:
    break;
  case 0x1a:
    UINT16_Marshal(&(source->rsassa).hashAlg,buffer,size);
    UINT16_Marshal(&(source->ecdaa).count,buffer,size);
    UVar1 = 4;
    break;
  default:
    if (selector != 5) {
      return 0;
    }
  case 0x14:
  case 0x16:
  case 0x18:
  case 0x1c:
    UINT16_Marshal(&(source->rsassa).hashAlg,buffer,size);
    UVar1 = 2;
  }
  return UVar1;
}

Assistant:

UINT16
TPMU_SIG_SCHEME_Marshal(TPMU_SIG_SCHEME *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_ECDAA
        case TPM_ALG_ECDAA:
            return TPMS_SIG_SCHEME_ECDAA_Marshal((TPMS_SIG_SCHEME_ECDAA *)&(source->ecdaa), buffer, size);
#endif // ALG_ECDAA
#if         ALG_RSASSA
        case TPM_ALG_RSASSA:
            return TPMS_SIG_SCHEME_RSASSA_Marshal((TPMS_SIG_SCHEME_RSASSA *)&(source->rsassa), buffer, size);
#endif // ALG_RSASSA
#if         ALG_RSAPSS
        case TPM_ALG_RSAPSS:
            return TPMS_SIG_SCHEME_RSAPSS_Marshal((TPMS_SIG_SCHEME_RSAPSS *)&(source->rsapss), buffer, size);
#endif // ALG_RSAPSS
#if         ALG_ECDSA
        case TPM_ALG_ECDSA:
            return TPMS_SIG_SCHEME_ECDSA_Marshal((TPMS_SIG_SCHEME_ECDSA *)&(source->ecdsa), buffer, size);
#endif // ALG_ECDSA
#if         ALG_SM2
        case TPM_ALG_SM2:
            return TPMS_SIG_SCHEME_SM2_Marshal((TPMS_SIG_SCHEME_SM2 *)&(source->sm2), buffer, size);
#endif // ALG_SM2
#if         ALG_ECSCHNORR
        case TPM_ALG_ECSCHNORR:
            return TPMS_SIG_SCHEME_ECSCHNORR_Marshal((TPMS_SIG_SCHEME_ECSCHNORR *)&(source->ecschnorr), buffer, size);
#endif // ALG_ECSCHNORR
#if         ALG_HMAC
        case TPM_ALG_HMAC:
            return TPMS_SCHEME_HMAC_Marshal((TPMS_SCHEME_HMAC *)&(source->hmac), buffer, size);
#endif // ALG_HMAC
        case TPM_ALG_NULL:
            return 0;
    }
    return 0;
}